

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

void __thiscall
baryonyx::itm::quadratic_cost_type<double>::quadratic_cost_type
          (quadratic_cost_type<double> *this,objective_function *obj_,int n)

{
  double dVar1;
  int iVar2;
  const_reference pvVar3;
  type pdVar4;
  type piVar5;
  const_reference pvVar6;
  type pqVar7;
  bool bVar8;
  index local_b4;
  bool is_b;
  int iStack_4c;
  bool is_a;
  int e_2;
  int i_2;
  int var_1;
  int id;
  int e_1;
  int i_1;
  int var;
  int e;
  int i;
  int n_local;
  objective_function *obj__local;
  quadratic_cost_type<double> *this_local;
  
  this->obj = obj_;
  std::make_unique<double[]>((size_t)&this->linear_elements);
  std::
  vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
  ::size(&this->obj->qelements);
  std::make_unique<baryonyx::itm::quadratic_cost_type<double>::quad[]>
            ((size_t)&this->quadratic_elements);
  std::make_unique<int[]>((size_t)&this->indices);
  var = 0;
  iVar2 = length<std::vector<baryonyx::objective_function_element,std::allocator<baryonyx::objective_function_element>>>
                    (&this->obj->elements);
  for (; var != iVar2; var = var + 1) {
    pvVar3 = std::
             vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ::operator[](&this->obj->elements,(long)var);
    bVar8 = false;
    if (-1 < pvVar3->variable_index) {
      pvVar3 = std::
               vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
               ::operator[](&this->obj->elements,(long)var);
      bVar8 = pvVar3->variable_index < n;
    }
    if (!bVar8) {
      details::fail_fast("Postcondition",
                         "0 <= obj.elements[i].variable_index && obj.elements[i].variable_index < n"
                         ,
                         "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                         ,"1173");
    }
    pvVar3 = std::
             vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ::operator[](&this->obj->elements,(long)var);
    dVar1 = pvVar3->factor;
    pvVar3 = std::
             vector<baryonyx::objective_function_element,_std::allocator<baryonyx::objective_function_element>_>
             ::operator[](&this->obj->elements,(long)var);
    pdVar4 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)pvVar3->variable_index);
    *pdVar4 = dVar1 + *pdVar4;
  }
  piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[](&this->indices,0);
  *piVar5 = 0;
  e_1 = 0;
  do {
    if (e_1 == n) {
      i_2 = 0;
      for (e_2 = 0; e_2 != n; e_2 = e_2 + 1) {
        iStack_4c = 0;
        iVar2 = length<std::vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>>
                          (&this->obj->qelements);
        for (; iStack_4c != iVar2; iStack_4c = iStack_4c + 1) {
          pvVar6 = std::
                   vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ::operator[](&this->obj->qelements,(long)iStack_4c);
          bVar8 = pvVar6->variable_index_a == e_2;
          pvVar6 = std::
                   vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                   ::operator[](&this->obj->qelements,(long)iStack_4c);
          if ((bVar8) || (pvVar6->variable_index_b == e_2)) {
            pvVar6 = std::
                     vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                     ::operator[](&this->obj->qelements,(long)iStack_4c);
            dVar1 = pvVar6->factor;
            pqVar7 = std::
                     unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ::operator[](&this->quadratic_elements,(long)i_2);
            pqVar7->factor = dVar1;
            if (bVar8) {
              pvVar6 = std::
                       vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                       ::operator[](&this->obj->qelements,(long)iStack_4c);
              local_b4 = pvVar6->variable_index_b;
            }
            else {
              pvVar6 = std::
                       vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                       ::operator[](&this->obj->qelements,(long)iStack_4c);
              local_b4 = pvVar6->variable_index_a;
            }
            pqVar7 = std::
                     unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
                     ::operator[](&this->quadratic_elements,(long)i_2);
            pqVar7->id = local_b4;
            i_2 = i_2 + 1;
          }
        }
      }
      return;
    }
    piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->indices,(long)e_1);
    iVar2 = *piVar5;
    piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                       (&this->indices,(long)(e_1 + 1));
    *piVar5 = iVar2;
    id = 0;
    iVar2 = length<std::vector<baryonyx::objective_quadratic_element,std::allocator<baryonyx::objective_quadratic_element>>>
                      (&this->obj->qelements);
    for (; id != iVar2; id = id + 1) {
      pvVar6 = std::
               vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ::operator[](&this->obj->qelements,(long)id);
      bVar8 = false;
      if (-1 < pvVar6->variable_index_a) {
        pvVar6 = std::
                 vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ::operator[](&this->obj->qelements,(long)id);
        bVar8 = pvVar6->variable_index_a < n;
      }
      if (!bVar8) {
        details::fail_fast("Postcondition",
                           "0 <= obj.qelements[i].variable_index_a && obj.qelements[i].variable_index_a < n"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                           ,"1185");
      }
      pvVar6 = std::
               vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ::operator[](&this->obj->qelements,(long)id);
      bVar8 = false;
      if (-1 < pvVar6->variable_index_b) {
        pvVar6 = std::
                 vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ::operator[](&this->obj->qelements,(long)id);
        bVar8 = pvVar6->variable_index_b < n;
      }
      if (!bVar8) {
        details::fail_fast("Postcondition",
                           "0 <= obj.qelements[i].variable_index_b && obj.qelements[i].variable_index_b < n"
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-common.hpp"
                           ,"1187");
      }
      pvVar6 = std::
               vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
               ::operator[](&this->obj->qelements,(long)id);
      if (e_1 == pvVar6->variable_index_a) {
LAB_00229a08:
        piVar5 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                           (&this->indices,(long)(e_1 + 1));
        *piVar5 = *piVar5 + 1;
      }
      else {
        pvVar6 = std::
                 vector<baryonyx::objective_quadratic_element,_std::allocator<baryonyx::objective_quadratic_element>_>
                 ::operator[](&this->obj->qelements,(long)id);
        if (e_1 == pvVar6->variable_index_b) goto LAB_00229a08;
      }
    }
    e_1 = e_1 + 1;
  } while( true );
}

Assistant:

quadratic_cost_type(const objective_function& obj_, int n)
      : obj(obj_)
      , linear_elements(std::make_unique<Float[]>(n))
      , quadratic_elements(
          std::make_unique<quad[]>(2 * obj.qelements.size() + 1))
      , indices(std::make_unique<int[]>(n + 1))
    {
        for (int i = 0, e = length(obj.elements); i != e; ++i) {
            bx_ensures(0 <= obj.elements[i].variable_index &&
                       obj.elements[i].variable_index < n);

            linear_elements[obj.elements[i].variable_index] +=
              static_cast<Float>(obj.elements[i].factor);
        }

        indices[0] = 0;
        for (int var = 0; var != n; ++var) {
            indices[var + 1] = indices[var];

            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                bx_ensures(0 <= obj.qelements[i].variable_index_a &&
                           obj.qelements[i].variable_index_a < n);
                bx_ensures(0 <= obj.qelements[i].variable_index_b &&
                           obj.qelements[i].variable_index_b < n);

                if (var == obj.qelements[i].variable_index_a ||
                    var == obj.qelements[i].variable_index_b)
                    ++indices[var + 1];
            }
        }

        for (int id = 0, var = 0; var != n; ++var) {
            for (int i = 0, e = length(obj.qelements); i != e; ++i) {
                const bool is_a = obj.qelements[i].variable_index_a == var;
                const bool is_b = obj.qelements[i].variable_index_b == var;

                if (is_a || is_b) {
                    quadratic_elements[id].factor =
                      static_cast<Float>(obj.qelements[i].factor);
                    quadratic_elements[id].id =
                      is_a ? obj.qelements[i].variable_index_b
                           : obj.qelements[i].variable_index_a;
                    ++id;
                }
            }
        }
    }